

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O1

string * __thiscall
OnDiskDataset::get_id_abi_cxx11_(string *__return_storage_ptr__,OnDiskDataset *this)

{
  DatabaseName dbname;
  DatabaseName DStack_f8;
  path local_58;
  
  std::experimental::filesystem::v1::__cxx11::path::path(&local_58,&this->db_base);
  DatabaseName::parse(&DStack_f8,&local_58,&this->name);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_58);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,DStack_f8.id._M_dataplus._M_p,
             DStack_f8.id._M_dataplus._M_p + DStack_f8.id._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)DStack_f8.filename._M_dataplus._M_p != &DStack_f8.filename.field_2) {
    operator_delete(DStack_f8.filename._M_dataplus._M_p,
                    DStack_f8.filename.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)DStack_f8.id._M_dataplus._M_p != &DStack_f8.id.field_2) {
    operator_delete(DStack_f8.id._M_dataplus._M_p,DStack_f8.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)DStack_f8.type._M_dataplus._M_p != &DStack_f8.type.field_2) {
    operator_delete(DStack_f8.type._M_dataplus._M_p,DStack_f8.type.field_2._M_allocated_capacity + 1
                   );
  }
  std::experimental::filesystem::v1::__cxx11::path::~path(&DStack_f8.db_base);
  return __return_storage_ptr__;
}

Assistant:

std::string OnDiskDataset::get_id() const {
    // TODO(unknown): use DatabaseName as a class member instead
    auto dbname = DatabaseName::parse(db_base, name);
    return dbname.get_id();
}